

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

void __thiscall
cppcms::applications_pool::_data::attachment::attachment
          (attachment *this,shared_ptr<cppcms::application_specific_pool> *p,mount_point *m)

{
  mount_point::mount_point(&this->mp,m);
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->pool).
              super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>,
             &p->super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

attachment(booster::shared_ptr<application_specific_pool> p,mount_point const &m) : mp(m), pool(p) {}